

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall QHttp2Connection::handleDATA(QHttp2Connection *this)

{
  QHttp2Connection *this_00;
  bool bVar1;
  quint32 qVar2;
  FrameFlags FVar3;
  QHttp2Stream *this_01;
  qsizetype qVar4;
  Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> *pDVar5;
  ulong uVar6;
  char *message;
  uint uVar7;
  long in_FS_OFFSET;
  const_iterator cVar8;
  QLatin1StringView message_00;
  Http2Error HStack_70;
  uint local_68 [2];
  undefined8 local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 local_4c;
  char *local_48;
  quint32 streamID;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x238;
  qVar2 = Http2::Frame::streamID((Frame *)this_00);
  streamID = qVar2;
  if (qVar2 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      message = "DATA on the connection stream";
      HStack_70 = PROTOCOL_ERROR;
LAB_001d7e1a:
      connectionError(this,HStack_70,message);
      return;
    }
  }
  else {
    bVar1 = isInvalidStream(this,qVar2);
    if (bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        message = "DATA on invalid stream";
        HStack_70 = ENHANCE_YOUR_CALM;
        goto LAB_001d7e1a;
      }
    }
    else {
      this_01 = getStream(this,qVar2);
      if ((this_01->m_state & ~ReservedRemote) == HalfClosedRemote) {
        qVar4 = QtPrivate::lengthHelperPointer<char>("Data on closed stream");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          message_00.m_data = "Data on closed stream";
          message_00.m_size = qVar4;
          QHttp2Stream::streamError((QHttp2Stream *)this_01,STREAM_CLOSED,message_00);
          return;
        }
      }
      else {
        qVar2 = Http2::Frame::payloadSize((Frame *)this_00);
        if (*(int *)(this + 0x294) < (int)qVar2) {
          qHttp2ConnectionLog();
          if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i
              & 1) != 0) {
            local_60._0_4_ = 2;
            local_60._4_4_ = 0;
            uStack_58 = 0;
            uStack_54 = 0;
            uStack_50 = 0;
            local_4c = 0;
            local_48 = qHttp2ConnectionLog::category.name;
            qVar2 = Http2::Frame::payloadSize((Frame *)this_00);
            QMessageLogger::debug
                      ((char *)&local_60,
                       "[%p] Received DATA frame with payload size %u, but recvWindow is %d, sending FLOW_CONTROL_ERROR"
                       ,this,(ulong)qVar2,(ulong)*(uint *)(this + 0x294));
          }
          connectionError(this,FLOW_CONTROL_ERROR,"Flow control error");
        }
        else {
          qVar2 = Http2::Frame::payloadSize((Frame *)this_00);
          *(quint32 *)(this + 0x294) = *(int *)(this + 0x294) - qVar2;
          cVar8 = QHash<unsigned_int,_QPointer<QHttp2Stream>_>::constFindImpl<unsigned_int>
                            ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)(this + 0x1c0),
                             &streamID);
          pDVar5 = cVar8.i.d;
          if (pDVar5 != (Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> *)0x0 ||
              cVar8.i.bucket != 0) {
            uVar6 = cVar8.i.bucket >> 7;
            uVar7 = (uint)cVar8.i.bucket & 0x7f;
            bVar1 = QPointer::operator_cast_to_bool
                              ((QPointer *)
                               (pDVar5->spans[uVar6].entries[pDVar5->spans[uVar6].offsets[uVar7]].
                                storage.data + 8));
            if (bVar1) {
              QHttp2Stream::handleDATA
                        (*(QHttp2Stream **)
                          (pDVar5->spans[uVar6].entries[pDVar5->spans[uVar6].offsets[uVar7]].storage
                           .data + 0x10),(Frame *)this_00);
            }
          }
          FVar3 = Http2::Frame::flags((Frame *)this_00);
          if (((uint)FVar3.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
                     super_QFlagsStorage<Http2::FrameFlag>.i & 1) != 0) {
            receivedEND_STREAM(this,streamID);
          }
          if (*(int *)(this + 0x294) < *(int *)(this + 0x290) / 2) {
            local_60._0_4_ = 0x1d619e;
            local_60._4_4_ = 0;
            uStack_58 = 0;
            uStack_54 = 0;
            local_68[1] = 0;
            local_68[0] = *(int *)(this + 0x290) - *(int *)(this + 0x294);
            QMetaObject::
            invokeMethod<bool(QHttp2Connection::*)(unsigned_int,unsigned_int),unsigned_int,unsigned_int>
                      ((ContextType *)this,&local_60,QueuedConnection,local_68 + 1,local_68);
            *(undefined4 *)(this + 0x294) = *(undefined4 *)(this + 0x290);
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handleDATA()
{
    Q_ASSERT(inboundFrame.type() == FrameType::DATA);

    const auto streamID = inboundFrame.streamID();

    // RFC9113, 6.1: An endpoint that receives an unexpected stream identifier MUST respond
    // with a connection error.
    if (streamID == connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "DATA on the connection stream");

    if (isInvalidStream(streamID))
        return connectionError(ENHANCE_YOUR_CALM, "DATA on invalid stream");

    // RFC9113, 6.1: If a DATA frame is received whose stream is not in the "open" or
    // "half-closed (local)" state, the recipient MUST respond with a stream error.
    auto stream = getStream(streamID);
    if (stream->state() == QHttp2Stream::State::HalfClosedRemote
        || stream->state() == QHttp2Stream::State::Closed) {
        return stream->streamError(Http2Error::STREAM_CLOSED,
                                   QLatin1String("Data on closed stream"));
    }

    if (qint32(inboundFrame.payloadSize()) > sessionReceiveWindowSize) {
        qCDebug(qHttp2ConnectionLog,
                "[%p] Received DATA frame with payload size %u, "
                "but recvWindow is %d, sending FLOW_CONTROL_ERROR",
                this, inboundFrame.payloadSize(), sessionReceiveWindowSize);
        return connectionError(FLOW_CONTROL_ERROR, "Flow control error");
    }

    sessionReceiveWindowSize -= inboundFrame.payloadSize();

    auto it = m_streams.constFind(streamID);
    if (it != m_streams.cend() && it.value())
        it.value()->handleDATA(inboundFrame);

    if (inboundFrame.flags().testFlag(FrameFlag::END_STREAM))
        emit receivedEND_STREAM(streamID);

    if (sessionReceiveWindowSize < maxSessionReceiveWindowSize / 2) {
        // @future[consider]: emit signal instead
        QMetaObject::invokeMethod(this, &QHttp2Connection::sendWINDOW_UPDATE, Qt::QueuedConnection,
                                  quint32(connectionStreamID),
                                  quint32(maxSessionReceiveWindowSize - sessionReceiveWindowSize));
        sessionReceiveWindowSize = maxSessionReceiveWindowSize;
    }
}